

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderDeviceGLImpl.cpp
# Opt level: O0

void __thiscall
Diligent::RenderDeviceGLImpl::CreateBufferFromGLHandle
          (RenderDeviceGLImpl *this,Uint32 GLHandle,BufferDesc *BuffDesc,RESOURCE_STATE InitialState
          ,IBuffer **ppBuffer)

{
  undefined8 ppBuffer_00;
  bool bVar1;
  Char *pCVar2;
  DeviceContextGLImpl *this_00;
  GLContextState *__t;
  bool local_91;
  reference_wrapper<Diligent::GLContextState> local_90;
  undefined1 local_88 [8];
  string msg_1;
  RefCntAutoPtr<Diligent::DeviceContextGLImpl> pDeviceContext;
  undefined1 local_50 [8];
  string msg;
  IBuffer **ppBuffer_local;
  RESOURCE_STATE InitialState_local;
  BufferDesc *BuffDesc_local;
  RenderDeviceGLImpl *pRStack_10;
  Uint32 GLHandle_local;
  RenderDeviceGLImpl *this_local;
  
  msg.field_2._8_8_ = ppBuffer;
  BuffDesc_local._4_4_ = GLHandle;
  pRStack_10 = this;
  if (GLHandle == 0) {
    FormatString<char[34]>((string *)local_50,(char (*) [34])"GL buffer handle must not be null");
    pCVar2 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar2,"CreateBufferFromGLHandle",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/RenderDeviceGLImpl.cpp"
               ,0x175);
    std::__cxx11::string::~string((string *)local_50);
  }
  RenderDeviceBase<Diligent::EngineGLImplTraits>::GetImmediateContext
            ((RenderDeviceBase<Diligent::EngineGLImplTraits> *)((long)&msg_1.field_2 + 8),
             (size_t)this);
  bVar1 = RefCntAutoPtr<Diligent::DeviceContextGLImpl>::operator!
                    ((RefCntAutoPtr<Diligent::DeviceContextGLImpl> *)((long)&msg_1.field_2 + 8));
  if (bVar1) {
    FormatString<char[44]>
              ((string *)local_88,(char (*) [44])"Immediate device context has been destroyed");
    pCVar2 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar2,"CreateBufferFromGLHandle",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/RenderDeviceGLImpl.cpp"
               ,0x178);
    std::__cxx11::string::~string((string *)local_88);
  }
  ppBuffer_00 = msg.field_2._8_8_;
  this_00 = RefCntAutoPtr<Diligent::DeviceContextGLImpl>::operator->
                      ((RefCntAutoPtr<Diligent::DeviceContextGLImpl> *)((long)&msg_1.field_2 + 8));
  __t = DeviceContextGLImpl::GetContextState(this_00);
  local_90 = std::ref<Diligent::GLContextState>(__t);
  local_91 = false;
  RenderDeviceBase<Diligent::EngineGLImplTraits>::
  CreateBufferImpl<std::reference_wrapper<Diligent::GLContextState>,unsigned_int,bool>
            (&this->super_RenderDeviceBase<Diligent::EngineGLImplTraits>,(IBuffer **)ppBuffer_00,
             BuffDesc,&local_90,(uint *)((long)&BuffDesc_local + 4),&local_91);
  RefCntAutoPtr<Diligent::DeviceContextGLImpl>::~RefCntAutoPtr
            ((RefCntAutoPtr<Diligent::DeviceContextGLImpl> *)((long)&msg_1.field_2 + 8));
  return;
}

Assistant:

void RenderDeviceGLImpl::CreateBufferFromGLHandle(Uint32 GLHandle, const BufferDesc& BuffDesc, RESOURCE_STATE InitialState, IBuffer** ppBuffer)
{
    DEV_CHECK_ERR(GLHandle != 0, "GL buffer handle must not be null");

    auto pDeviceContext = GetImmediateContext(0);
    VERIFY(pDeviceContext, "Immediate device context has been destroyed");
    CreateBufferImpl(ppBuffer, BuffDesc, std::ref(pDeviceContext->GetContextState()), GLHandle, /*bIsDeviceInternal =*/false);
}